

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Fl_Window_Type::write_properties(Fl_Window_Type *this)

{
  char *format;
  
  Fl_Widget_Type::write_properties(&this->super_Fl_Widget_Type);
  if (this->modal == '\0') {
    if (this->non_modal == '\0') goto LAB_0018e3ec;
    format = "non_modal";
  }
  else {
    format = "modal";
  }
  write_string(format);
LAB_0018e3ec:
  if ((((this->super_Fl_Widget_Type).o)->flags_ & 8) != 0) {
    write_string("noborder");
  }
  if ((this->super_Fl_Widget_Type).xclass != (char *)0x0) {
    write_string("xclass");
    write_word((this->super_Fl_Widget_Type).xclass);
  }
  if (((this->sr_min_w != 0 || this->sr_min_h != 0) || this->sr_max_w != 0) || this->sr_max_h != 0)
  {
    write_string("size_range {%d %d %d %d}");
  }
  if ((((this->super_Fl_Widget_Type).o)->flags_ & 2) == 0) {
    write_string("visible");
    return;
  }
  return;
}

Assistant:

void Fl_Window_Type::write_properties() {
  Fl_Widget_Type::write_properties();
  if (modal) write_string("modal");
  else if (non_modal) write_string("non_modal");
  if (!((Fl_Window*)o)->border()) write_string("noborder");
  if (xclass) {write_string("xclass"); write_word(xclass);}
  if (sr_min_w || sr_min_h || sr_max_w || sr_max_h)
    write_string("size_range {%d %d %d %d}", sr_min_w, sr_min_h, sr_max_w, sr_max_h);
  if (o->visible()) write_string("visible");
}